

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONPackagePresets.cxx
# Opt level: O2

ReadFileResult
cmCMakePresetsGraphInternal::PackagePresetsHelper
          (vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::PackagePreset> *in_R8;
  Object<cmCMakePresetsGraph::PackagePreset> OStack_38;
  
  if (PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::PackagePreset>::Object
                (&OStack_38,
                 (Object<cmCMakePresetsGraph::PackagePreset> *)
                 (anonymous_namespace)::PackagePresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>>
                (&PackagePresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&OStack_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
      ::~vector(&OStack_38.Members);
      __cxa_atexit(std::_Function_base::~_Function_base,&PackagePresetsHelper::helper,&__dso_handle)
      ;
      __cxa_guard_release(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar1 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_&,_const_Json::Value_*)>
          ::operator()(&PackagePresetsHelper::helper,out,value);
  return RVar1;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PackagePresetsHelper(
  std::vector<cmCMakePresetsGraph::PackagePreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<PackagePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      PackagePresetHelper);

  return helper(out, value);
}